

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrecord.cpp
# Opt level: O2

void __thiscall QSqlRecord::clearValues(QSqlRecord *this)

{
  iterator this_00;
  iterator iVar1;
  QSqlField *f;
  QList<QSqlField> *this_01;
  
  QExplicitlySharedDataPointer<QSqlRecordPrivate>::detach(&this->d);
  this_01 = &((this->d).d.ptr)->fields;
  this_00 = QList<QSqlField>::begin(this_01);
  iVar1 = QList<QSqlField>::end(this_01);
  for (; this_00.i != iVar1.i; this_00.i = this_00.i + 1) {
    QSqlField::clear(this_00.i);
  }
  return;
}

Assistant:

void QSqlRecord::clearValues()
{
    detach();
    for (QSqlField &f : d->fields)
        f.clear();
}